

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::Matcher<const_unsigned_char_&>::Matcher(Matcher<const_unsigned_char_&> *this,uchar *value)

{
  ComparisonBase<testing::internal::EqMatcher<unsigned_char>,_unsigned_char,_testing::internal::AnyEq>
  local_31;
  Matcher<const_unsigned_char_&> local_30;
  uchar *local_18;
  uchar *value_local;
  Matcher<const_unsigned_char_&> *this_local;
  
  local_18 = value;
  value_local = (uchar *)this;
  testing::internal::MatcherBase<const_unsigned_char_&>::MatcherBase
            (&this->super_MatcherBase<const_unsigned_char_&>);
  (this->super_MatcherBase<const_unsigned_char_&>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__Matcher_003ce5b8;
  local_31.rhs_ = (uchar)Eq<unsigned_char>(*local_18);
  Matcher<unsigned_char_const&>::Matcher<testing::internal::EqMatcher<unsigned_char>,void>
            ((Matcher<unsigned_char_const&> *)&local_30,(EqMatcher<unsigned_char> *)&local_31);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }